

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  char *in_RAX;
  char *unaff_RBX;
  int index;
  size_t sVar4;
  bigit borrow;
  undefined8 uVar5;
  
  if (other->exp_ < this->exp_) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  iVar3 = compare(this,other);
  if (-1 < iVar3) {
    uVar5 = 0;
    iVar3 = other->exp_;
    iVar1 = this->exp_;
    sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
    for (sVar4 = 0; index = (int)sVar4 + (iVar3 - iVar1), sVar2 != sVar4; sVar4 = sVar4 + 1) {
      subtract_bigits(this,index,(other->bigits_).super_buffer<unsigned_int>.ptr_[sVar4],
                      (bigit *)&stack0xffffffffffffffcc);
    }
    while ((bigit)((ulong)uVar5 >> 0x20) != 0) {
      subtract_bigits(this,index,0,(bigit *)&stack0xffffffffffffffcc);
    }
    remove_leading_zeros(this);
    return;
  }
  assert_fail(unaff_RBX,0,in_RAX);
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }